

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicornafl.cpp
# Opt level: O0

void __thiscall UCAFL::_may_use_mmap_testcase(UCAFL *this)

{
  int __fd;
  int iVar1;
  uint32_t *puVar2;
  undefined1 local_a8 [4];
  int fd;
  stat st;
  off_t ret;
  UCAFL *this_local;
  
  memset(local_a8,0,0x90);
  if (((this->afl_use_shm_testcase_ ^ 0xffU) & 1) != 0) {
    this->afl_testcase_len_p_ = &this->afl_testcase_len_;
    __fd = open(this->input_file_,0);
    iVar1 = fstat(__fd,(stat *)local_a8);
    if (iVar1 != 0) {
      perror("[!] Fail to stat.");
      exit(1);
    }
    puVar2 = (uint32_t *)mmap((void *)0x0,st.st_rdev,3,2,__fd,0);
    this->afl_testcase_ptr_ = puVar2;
    if (this->afl_testcase_ptr_ == (uint32_t *)0xffffffffffffffff) {
      perror("[!] Fail to mmap testcase.");
      exit(1);
    }
    this->afl_testcase_len_ = (uint32_t)st.st_rdev;
    close(__fd);
  }
  return;
}

Assistant:

void _may_use_mmap_testcase() {
        off_t ret;
        struct stat st = {0};

        if (unlikely(!this->afl_use_shm_testcase_)) {
            this->afl_testcase_len_p_ = &this->afl_testcase_len_;
            int fd = open(this->input_file_, O_RDONLY);

            if (fstat(fd, &st)) {
                perror("[!] Fail to stat.");
                exit(1);
            }

            this->afl_testcase_ptr_ = (uint32_t*)mmap(
                NULL, st.st_size, PROT_READ | PROT_WRITE, MAP_PRIVATE, fd, 0);

            if (this->afl_testcase_ptr_ == MAP_FAILED) {
                perror("[!] Fail to mmap testcase.");
                exit(1);
            }

            this->afl_testcase_len_ = (uint32_t)st.st_size;

            close(fd);
        }
    }